

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btConvexConcaveCollisionAlgorithm::processCollision
          (btConvexConcaveCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btCollisionShape *pbVar1;
  btPersistentManifold *pbVar2;
  btCollisionObject *pbVar3;
  btCollisionObject *pbVar4;
  btConcaveShape *concaveShape;
  btCollisionObjectWrapper *triBodyWrap;
  btScalar collisionMarginTriangle;
  
  triBodyWrap = body1Wrap;
  if (this->m_isSwapped != false) {
    triBodyWrap = body0Wrap;
    body0Wrap = body1Wrap;
  }
  pbVar1 = triBodyWrap->m_shape;
  if ((pbVar1->m_shapeType - 0x15U < 9) && (body0Wrap->m_shape->m_shapeType < 0x14)) {
    (*pbVar1->_vptr_btCollisionShape[0xc])(pbVar1);
    resultOut->m_manifoldPtr = (this->m_btConvexTriangleCallback).m_manifoldPtr;
    btConvexTriangleCallback::setTimeStepAndCounters
              (&this->m_btConvexTriangleCallback,collisionMarginTriangle,dispatchInfo,body0Wrap,
               triBodyWrap,resultOut);
    pbVar2 = (this->m_btConvexTriangleCallback).m_manifoldPtr;
    pbVar4 = triBodyWrap->m_collisionObject;
    pbVar2->m_body0 = body0Wrap->m_collisionObject;
    pbVar2->m_body1 = pbVar4;
    (*pbVar1->_vptr_btCollisionShape[0x10])
              (pbVar1,&this->m_btConvexTriangleCallback,
               &(this->m_btConvexTriangleCallback).m_aabbMin,
               &(this->m_btConvexTriangleCallback).m_aabbMax);
    pbVar2 = resultOut->m_manifoldPtr;
    if (pbVar2->m_cachedPoints != 0) {
      pbVar4 = resultOut->m_body0Wrap->m_collisionObject;
      if (pbVar2->m_body0 == pbVar4) {
        pbVar3 = resultOut->m_body1Wrap->m_collisionObject;
      }
      else {
        pbVar3 = pbVar4;
        pbVar4 = resultOut->m_body1Wrap->m_collisionObject;
      }
      btPersistentManifold::refreshContactPoints
                (pbVar2,&pbVar4->m_worldTransform,&pbVar3->m_worldTransform);
    }
    (this->m_btConvexTriangleCallback).m_convexBodyWrap = (btCollisionObjectWrapper *)0x0;
    (this->m_btConvexTriangleCallback).m_triBodyWrap = (btCollisionObjectWrapper *)0x0;
  }
  return;
}

Assistant:

void btConvexConcaveCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	
	
	const btCollisionObjectWrapper* convexBodyWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const btCollisionObjectWrapper* triBodyWrap = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBodyWrap->getCollisionShape()->isConcave())
	{


		
		const btConcaveShape* concaveShape = static_cast<const btConcaveShape*>( triBodyWrap->getCollisionShape());
		
		if (convexBodyWrap->getCollisionShape()->isConvex())
		{
			btScalar collisionMarginTriangle = concaveShape->getMargin();
					
			resultOut->setPersistentManifold(m_btConvexTriangleCallback.m_manifoldPtr);
			m_btConvexTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle,dispatchInfo,convexBodyWrap,triBodyWrap,resultOut);

			m_btConvexTriangleCallback.m_manifoldPtr->setBodies(convexBodyWrap->getCollisionObject(),triBodyWrap->getCollisionObject());

			concaveShape->processAllTriangles( &m_btConvexTriangleCallback,m_btConvexTriangleCallback.getAabbMin(),m_btConvexTriangleCallback.getAabbMax());
			
			resultOut->refreshContactPoints();

			m_btConvexTriangleCallback.clearWrapperData();
	
		}
	
	}

}